

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O1

void __thiscall
xLearn::FFMScore::calc_grad_adagrad
          (FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  pointer pNVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  real_t *prVar5;
  float fVar6;
  undefined1 auVar7 [16];
  pointer pNVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  pointer pNVar12;
  ulong uVar13;
  float fVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  pointer pNVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar21 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar22 [64];
  float fVar23;
  float fVar24;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar36 [16];
  float fVar37;
  
  auVar34 = in_ZMM8._0_16_;
  auVar22._4_60_ = in_register_00001244;
  auVar22._0_4_ = norm;
  auVar21._4_60_ = in_register_00001204;
  auVar21._0_4_ = pg;
  auVar20 = auVar21._0_16_;
  if (norm < 0.0) {
    fVar11 = sqrtf(norm);
    auVar20 = ZEXT416((uint)pg);
    auVar22 = ZEXT464((uint)norm);
  }
  else {
    auVar7 = vsqrtss_avx(auVar22._0_16_,auVar22._0_16_);
    fVar11 = auVar7._0_4_;
  }
  uVar3 = model->num_feat_;
  uVar4 = model->num_field_;
  pNVar8 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar18 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  fVar37 = auVar20._0_4_;
  if (pNVar8 != pNVar18) {
    prVar5 = model->param_w_;
    pNVar12 = pNVar8;
    do {
      if (pNVar12->feat_id < uVar3) {
        uVar13 = (ulong)(pNVar12->feat_id * 2);
        auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar37 * pNVar12->feat_val)),
                                  ZEXT416((uint)prVar5[uVar13]),
                                  ZEXT416((uint)(this->super_Score).regu_lambda_));
        auVar7 = vfmadd231ss_fma(ZEXT416((uint)prVar5[uVar13 + 1]),auVar25,auVar25);
        fVar23 = auVar7._0_4_;
        prVar5[uVar13 + 1] = fVar23;
        fVar14 = (float)(0x5f375a86 - ((int)fVar23 >> 1));
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)(fVar23 * -0.5 * fVar14)),ZEXT416((uint)fVar14),
                                 SUB6416(ZEXT464(0x3fc00000),0));
        auVar7 = vfnmadd213ss_fma(ZEXT416((uint)(auVar25._0_4_ * (this->super_Score).learning_rate_)
                                         ),ZEXT416((uint)(auVar7._0_4_ * fVar14)),
                                  ZEXT416((uint)prVar5[uVar13]));
        prVar5[uVar13] = auVar7._0_4_;
      }
      pNVar12 = pNVar12 + 1;
    } while (pNVar12 != pNVar18);
  }
  prVar5 = model->param_b_;
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)prVar5[1]),auVar20,auVar20);
  fVar14 = auVar20._0_4_;
  prVar5[1] = fVar14;
  fVar11 = (float)(0x5f375a86 - ((int)fVar14 >> 1));
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)(fVar14 * -0.5 * fVar11)),ZEXT416((uint)fVar11),
                            ZEXT416(0x3fc00000));
  auVar20 = vfnmadd213ss_fma(ZEXT416((uint)(fVar37 * (this->super_Score).learning_rate_)),
                             ZEXT416((uint)(auVar20._0_4_ * fVar11)),ZEXT416((uint)*prVar5));
  *prVar5 = auVar20._0_4_;
  if (pNVar8 != (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    auVar20 = vcvtusi2ss_avx512f(auVar34,model->num_K_);
    auVar20 = ZEXT416((uint)(auVar20._0_4_ * 0.25));
    auVar20 = vroundss_avx(auVar20,auVar20,10);
    uVar9 = vcvttss2usi_avx512f(auVar20);
    uVar10 = uVar9 * 8;
    fVar11 = (this->super_Score).learning_rate_;
    prVar5 = model->param_v_;
    fVar14 = (this->super_Score).regu_lambda_;
    do {
      if ((pNVar8->field_id < uVar4 && pNVar8->feat_id < uVar3) &&
         (pNVar8 + 1 !=
          (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
          super__Vector_impl_data._M_finish)) {
        fVar23 = pNVar8->feat_val;
        uVar13 = (ulong)(pNVar8->feat_id * uVar10 * uVar4);
        uVar15 = (ulong)(pNVar8->field_id * uVar10);
        pNVar18 = pNVar8;
        pNVar12 = pNVar8 + 1;
        do {
          if ((pNVar18[1].field_id < uVar4 && pNVar18[1].feat_id < uVar3) &&
             ((uVar9 & 0x1fffffff) != 0)) {
            uVar19 = (ulong)(pNVar18[1].field_id * uVar10);
            uVar16 = (ulong)(pNVar18[1].feat_id * uVar10 * uVar4);
            fVar6 = fVar37 * fVar23 * pNVar18[1].feat_val * auVar22._0_4_;
            uVar17 = 0;
            do {
              auVar20 = *(undefined1 (*) [16])(prVar5 + uVar13 + uVar19 + uVar17);
              auVar34 = *(undefined1 (*) [16])(prVar5 + uVar15 + uVar16 + uVar17);
              fVar24 = fVar14 * auVar20._0_4_ + fVar6 * auVar34._0_4_;
              fVar27 = fVar14 * auVar20._4_4_ + fVar6 * auVar34._4_4_;
              fVar28 = fVar14 * auVar20._8_4_ + fVar6 * auVar34._8_4_;
              fVar29 = fVar14 * auVar20._12_4_ + fVar6 * auVar34._12_4_;
              fVar30 = fVar6 * auVar20._0_4_ + fVar14 * auVar34._0_4_;
              fVar31 = fVar6 * auVar20._4_4_ + fVar14 * auVar34._4_4_;
              fVar32 = fVar6 * auVar20._8_4_ + fVar14 * auVar34._8_4_;
              fVar33 = fVar6 * auVar20._12_4_ + fVar14 * auVar34._12_4_;
              pfVar2 = prVar5 + uVar13 + uVar19 + uVar17 + 4;
              auVar35._0_4_ = fVar24 * fVar24 + *pfVar2;
              auVar35._4_4_ = fVar27 * fVar27 + pfVar2[1];
              auVar35._8_4_ = fVar28 * fVar28 + pfVar2[2];
              auVar35._12_4_ = fVar29 * fVar29 + pfVar2[3];
              pfVar2 = prVar5 + uVar15 + uVar16 + uVar17 + 4;
              auVar36._0_4_ = fVar30 * fVar30 + *pfVar2;
              auVar36._4_4_ = fVar31 * fVar31 + pfVar2[1];
              auVar36._8_4_ = fVar32 * fVar32 + pfVar2[2];
              auVar36._12_4_ = fVar33 * fVar33 + pfVar2[3];
              auVar7 = vrsqrtps_avx(auVar35);
              auVar25._0_4_ = fVar11 * auVar7._0_4_ * fVar24;
              auVar25._4_4_ = fVar11 * auVar7._4_4_ * fVar27;
              auVar25._8_4_ = fVar11 * auVar7._8_4_ * fVar28;
              auVar25._12_4_ = fVar11 * auVar7._12_4_ * fVar29;
              auVar7 = vsubps_avx(auVar20,auVar25);
              auVar20 = vrsqrtps_avx(auVar36);
              auVar26._0_4_ = fVar11 * fVar30 * auVar20._0_4_;
              auVar26._4_4_ = fVar11 * fVar31 * auVar20._4_4_;
              auVar26._8_4_ = fVar11 * fVar32 * auVar20._8_4_;
              auVar26._12_4_ = fVar11 * fVar33 * auVar20._12_4_;
              auVar20 = vsubps_avx(auVar34,auVar26);
              *(undefined1 (*) [16])(prVar5 + uVar13 + uVar19 + uVar17) = auVar7;
              *(undefined1 (*) [16])(prVar5 + uVar15 + uVar16 + uVar17) = auVar20;
              *(undefined1 (*) [16])(prVar5 + uVar13 + uVar19 + uVar17 + 4) = auVar35;
              *(undefined1 (*) [16])(prVar5 + uVar15 + uVar16 + uVar17 + 4) = auVar36;
              uVar17 = uVar17 + 8;
            } while (uVar17 < uVar10);
          }
          pNVar1 = pNVar12 + 1;
          pNVar18 = pNVar12;
          pNVar12 = pNVar1;
        } while (pNVar1 != (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                           _M_impl.super__Vector_impl_data._M_finish);
      }
      pNVar8 = pNVar8 + 1;
    } while (pNVar8 != (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void FFMScore::calc_grad_adagrad(const SparseRow* row,
                                 Model& model,
                                 real_t pg,
                                 real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*2];
    real_t &wlg = w[feat_id*2+1];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wlg += g*g;
    wl -= learning_rate_ * g * InvSqrt(wlg);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t g = pg;
  wbg += g*g;
  wb -= learning_rate_ * g * InvSqrt(wbg);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = 2 * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * 2;
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        real_t *wg1 = w1 + kAlign;
        real_t *wg2 = w2 + kAlign;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMwg1 = _mm_load_ps(wg1);
        __m128 XMMwg2 = _mm_load_ps(wg2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        XMMwg1 = _mm_add_ps(XMMwg1, _mm_mul_ps(XMMg1, XMMg1));
        XMMwg2 = _mm_add_ps(XMMwg2, _mm_mul_ps(XMMg2, XMMg2));
        XMMw1 = _mm_sub_ps(XMMw1, _mm_mul_ps(XMMlr,
                _mm_mul_ps(_mm_rsqrt_ps(XMMwg1), XMMg1)));
        XMMw2 = _mm_sub_ps(XMMw2, _mm_mul_ps(XMMlr,
                _mm_mul_ps(_mm_rsqrt_ps(XMMwg2), XMMg2)));
        _mm_store_ps(w1, XMMw1);
        _mm_store_ps(w2, XMMw2);
        _mm_store_ps(wg1, XMMwg1);
        _mm_store_ps(wg2, XMMwg2);
      }
    }
  }
}